

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

char * getF(lua_State *L,void *ud,size_t *size)

{
  int iVar1;
  size_t sVar2;
  
  if ((long)*ud < 1) {
    iVar1 = feof(*(FILE **)((long)ud + 8));
    if (iVar1 != 0) {
      return (char *)0x0;
    }
    sVar2 = fread((void *)((long)ud + 0x10),1,0x2000,*(FILE **)((long)ud + 8));
    *size = sVar2;
  }
  else {
    *size = (long)*ud;
    *(undefined4 *)ud = 0;
  }
  return (char *)((long)ud + 0x10);
}

Assistant:

static const char *getF (lua_State *L, void *ud, size_t *size) {
  LoadF *lf = (LoadF *)ud;
  (void)L;  /* not used */
  if (lf->n > 0) {  /* are there pre-read characters to be read? */
    *size = lf->n;  /* return them (chars already in buffer) */
    lf->n = 0;  /* no more pre-read characters */
  }
  else {  /* read a block from file */
    /* 'fread' can return > 0 *and* set the EOF flag. If next call to
       'getF' called 'fread', it might still wait for user input.
       The next check avoids this problem. */
    if (feof(lf->f)) return NULL;
    *size = fread(lf->buff, 1, sizeof(lf->buff), lf->f);  /* read block */
  }
  return lf->buff;
}